

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::invalid_patch_parameteri
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_91;
  string local_90;
  GLint local_70;
  allocator<char> local_69;
  int maxPatchVertices;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  checkTessellationSupport(ctx);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if pname is not GL_PATCH_VERTICES.",
             &local_31);
  NegativeTestContext::beginSection(pNVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glPatchParameteri(&local_10->super_CallLogWrapper,0xffffffff,1);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxPatchVertices,
             "GL_INVALID_VALUE is generated if value is less than or equal to zero.",&local_69);
  NegativeTestContext::beginSection(pNVar1,(string *)&maxPatchVertices);
  std::__cxx11::string::~string((string *)&maxPatchVertices);
  std::allocator<char>::~allocator(&local_69);
  glu::CallLogWrapper::glPatchParameteri(&local_10->super_CallLogWrapper,0x8e72,0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  local_70 = 0;
  glu::CallLogWrapper::glGetIntegerv(&local_10->super_CallLogWrapper,0x8e7d,&local_70);
  NegativeTestContext::expectError(local_10,0);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "GL_INVALID_VALUE is generated if value is greater than GL_MAX_PATCH_VERTICES.",
             &local_91);
  NegativeTestContext::beginSection(pNVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  glu::CallLogWrapper::glPatchParameteri(&local_10->super_CallLogWrapper,0x8e72,local_70 + 1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void invalid_patch_parameteri (NegativeTestContext& ctx)
{
	checkTessellationSupport(ctx);

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_PATCH_VERTICES.");
	ctx.glPatchParameteri(-1, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if value is less than or equal to zero.");
	ctx.glPatchParameteri(GL_PATCH_VERTICES, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	int maxPatchVertices= 0;
	ctx.glGetIntegerv(GL_MAX_PATCH_VERTICES, &maxPatchVertices);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if value is greater than GL_MAX_PATCH_VERTICES.");
	ctx.glPatchParameteri(GL_PATCH_VERTICES, maxPatchVertices + 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}